

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

us_listen_socket_t *
us_socket_context_listen
          (int ssl,us_socket_context_t *context,char *host,int port,int options,int socket_ext_size)

{
  char *pcVar1;
  uint uVar2;
  us_socket_context_t *context_00;
  int iVar3;
  int iVar4;
  us_listen_socket_t *puVar5;
  char *__s;
  addrinfo **ppaVar6;
  addrinfo **ppaVar7;
  addrinfo *result;
  uint local_90;
  int enabled;
  us_socket_context_t *local_88;
  undefined4 local_7c;
  char port_string [16];
  addrinfo local_60;
  
  ppaVar6 = &result;
  if (ssl != 0) {
    puVar5 = us_internal_ssl_socket_context_listen
                       ((us_internal_ssl_socket_context_t *)context,host,port,options,
                        socket_ext_size);
    return puVar5;
  }
  local_60.ai_next = (addrinfo *)0x0;
  local_60.ai_addrlen = 0;
  local_60._20_4_ = 0;
  local_60.ai_addr = (sockaddr *)0x0;
  local_60.ai_canonname = (char *)0x0;
  local_60.ai_flags = 1;
  local_60.ai_family = 0;
  local_60.ai_socktype = 1;
  local_60.ai_protocol = 0;
  __s = port_string;
  local_88 = context;
  snprintf(__s,0x10,"%d");
  iVar3 = getaddrinfo(host,__s,&local_60,(addrinfo **)&result);
  if (iVar3 == 0) {
    local_90 = socket_ext_size;
    iVar3 = -1;
    while ((ppaVar7 = &result, iVar3 == -1 &&
           (pcVar1 = (char *)*ppaVar6, ppaVar7 = &result, pcVar1 != (char *)0x0))) {
      iVar3 = -1;
      if (*(int *)(pcVar1 + 4) == 10) {
        iVar3 = bsd_create_socket(10,*(int *)(pcVar1 + 8),*(int *)(pcVar1 + 0xc));
        __s = pcVar1;
      }
      ppaVar6 = (addrinfo **)(pcVar1 + 0x28);
    }
    while ((iVar3 == -1 && (pcVar1 = (char *)*ppaVar7, pcVar1 != (char *)0x0))) {
      iVar3 = -1;
      if (*(int *)(pcVar1 + 4) == 2) {
        iVar3 = bsd_create_socket(2,*(int *)(pcVar1 + 8),*(int *)(pcVar1 + 0xc));
        __s = pcVar1;
      }
      ppaVar7 = (addrinfo **)(pcVar1 + 0x28);
    }
    if (iVar3 == -1) {
      freeaddrinfo((addrinfo *)result);
    }
    else {
      if ((options & 1U) == 0) {
        enabled = 1;
        setsockopt(iVar3,1,0xf,&enabled,4);
      }
      enabled = 1;
      setsockopt(iVar3,1,2,&enabled,4);
      local_7c = 0;
      setsockopt(iVar3,0x29,0x1a,&local_7c,4);
      iVar4 = bind(iVar3,*(sockaddr **)(__s + 0x18),*(socklen_t *)(__s + 0x10));
      uVar2 = local_90;
      if ((iVar4 != 0) || (iVar4 = listen(iVar3,0x200), iVar4 != 0)) {
        close(iVar3);
        iVar3 = -1;
      }
      freeaddrinfo((addrinfo *)result);
      context_00 = local_88;
      if (iVar3 != -1) {
        puVar5 = (us_listen_socket_t *)us_create_poll(local_88->loop,0,0x40);
        us_poll_init((us_poll_t *)puVar5,iVar3,2);
        us_poll_start((us_poll_t *)puVar5,context_00->loop,1);
        (puVar5->s).context = context_00;
        (puVar5->s).timeout = 0;
        (puVar5->s).next = (us_socket_t *)0x0;
        us_internal_socket_context_link(context_00,(us_socket_t *)puVar5);
        puVar5->socket_ext_size = uVar2;
        return puVar5;
      }
    }
  }
  return (us_listen_socket_t *)0x0;
}

Assistant:

struct us_listen_socket_t *us_socket_context_listen(int ssl, struct us_socket_context_t *context, const char *host, int port, int options, int socket_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return us_internal_ssl_socket_context_listen((struct us_internal_ssl_socket_context_t *) context, host, port, options, socket_ext_size);
    }
#endif

    LIBUS_SOCKET_DESCRIPTOR listen_socket_fd = bsd_create_listen_socket(host, port, options);

    if (listen_socket_fd == LIBUS_SOCKET_ERROR) {
        return 0;
    }

    struct us_poll_t *p = us_create_poll(context->loop, 0, sizeof(struct us_listen_socket_t));
    us_poll_init(p, listen_socket_fd, POLL_TYPE_SEMI_SOCKET);
    us_poll_start(p, context->loop, LIBUS_SOCKET_READABLE);

    struct us_listen_socket_t *ls = (struct us_listen_socket_t *) p;

    ls->s.context = context;
    ls->s.timeout = 0;
    ls->s.next = 0;
    us_internal_socket_context_link(context, &ls->s);

    ls->socket_ext_size = socket_ext_size;

    return ls;
}